

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigTable.c
# Opt level: O1

void Aig_TableResize(Aig_Man_t *p)

{
  uint uVar1;
  Aig_Obj_t **__ptr;
  uint uVar2;
  Aig_Obj_t **ppAVar3;
  Aig_Obj_t *pAVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  Aig_Obj_t *pAVar9;
  Aig_Obj_t *pObj;
  timespec ts;
  timespec local_40;
  
  if (p->pTable == (Aig_Obj_t **)0x0) {
    __assert_fail("p->pTable != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigTable.c"
                  ,0x4b,"void Aig_TableResize(Aig_Man_t *)");
  }
  clock_gettime(3,&local_40);
  __ptr = p->pTable;
  uVar1 = p->nTableSize;
  uVar5 = (p->nObjs[6] + p->nObjs[5]) * 2 - 1;
  while( true ) {
    do {
      uVar6 = uVar5 + 1;
      uVar2 = uVar5 & 1;
      uVar5 = uVar6;
    } while (uVar2 != 0);
    if (uVar6 < 9) break;
    iVar7 = 5;
    while (uVar6 % (iVar7 - 2U) != 0) {
      uVar2 = iVar7 * iVar7;
      iVar7 = iVar7 + 2;
      if (uVar6 < uVar2) goto LAB_00613422;
    }
  }
LAB_00613422:
  p->nTableSize = uVar6;
  ppAVar3 = (Aig_Obj_t **)malloc((long)(int)uVar6 << 3);
  p->pTable = ppAVar3;
  iVar7 = 0;
  memset(ppAVar3,0,(long)(int)uVar6 << 3);
  if (0 < (int)uVar1) {
    uVar8 = 0;
    iVar7 = 0;
    do {
      pObj = __ptr[uVar8];
      if (pObj != (Aig_Obj_t *)0x0) {
        pAVar4 = (pObj->field_0).pNext;
        do {
          pAVar9 = pAVar4;
          ppAVar3 = Aig_TableFind(p,pObj);
          if (*ppAVar3 != (Aig_Obj_t *)0x0) {
            __assert_fail("*ppPlace == NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigTable.c"
                          ,0x5c,"void Aig_TableResize(Aig_Man_t *)");
          }
          *ppAVar3 = pObj;
          (pObj->field_0).pNext = (Aig_Obj_t *)0x0;
          if (pAVar9 == (Aig_Obj_t *)0x0) {
            pAVar4 = (Aig_Obj_t *)0x0;
          }
          else {
            pAVar4 = (pAVar9->field_0).pNext;
          }
          iVar7 = iVar7 + 1;
          pObj = pAVar9;
        } while (pAVar9 != (Aig_Obj_t *)0x0);
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != uVar1);
  }
  if (iVar7 == p->nObjs[6] + p->nObjs[5]) {
    if (__ptr != (Aig_Obj_t **)0x0) {
      free(__ptr);
    }
    return;
  }
  __assert_fail("Counter == Aig_ManNodeNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigTable.c"
                ,0x62,"void Aig_TableResize(Aig_Man_t *)");
}

Assistant:

void Aig_TableResize( Aig_Man_t * p )
{
    Aig_Obj_t * pEntry, * pNext;
    Aig_Obj_t ** pTableOld, ** ppPlace;
    int nTableSizeOld, Counter, i;
    abctime clk;
    assert( p->pTable != NULL );
clk = Abc_Clock();
    // save the old table
    pTableOld = p->pTable;
    nTableSizeOld = p->nTableSize;
    // get the new table
    p->nTableSize = Abc_PrimeCudd( 2 * Aig_ManNodeNum(p) ); 
    p->pTable = ABC_ALLOC( Aig_Obj_t *, p->nTableSize );
    memset( p->pTable, 0, sizeof(Aig_Obj_t *) * p->nTableSize );
    // rehash the entries from the old table
    Counter = 0;
    for ( i = 0; i < nTableSizeOld; i++ )
    for ( pEntry = pTableOld[i], pNext = pEntry? pEntry->pNext : NULL; 
          pEntry; pEntry = pNext, pNext = pEntry? pEntry->pNext : NULL )
    {
        // get the place where this entry goes in the table 
        ppPlace = Aig_TableFind( p, pEntry );
        assert( *ppPlace == NULL ); // should not be there
        // add the entry to the list
        *ppPlace = pEntry;
        pEntry->pNext = NULL;
        Counter++;
    }
    assert( Counter == Aig_ManNodeNum(p) );
//    printf( "Increasing the structural table size from %6d to %6d. ", nTableSizeOld, p->nTableSize );
//    ABC_PRT( "Time", Abc_Clock() - clk );
    // replace the table and the parameters
    ABC_FREE( pTableOld );
}